

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O2

void __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::rec_coface
          (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *this,
          vector<int,_std::allocator<int>_> *vertices,Siblings *curr_sib,int curr_nbVertices,
          vector<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
          *cofaces,bool star,int nbVertices)

{
  pointer piVar1;
  pointer piVar2;
  Siblings *curr_sib_00;
  int iVar3;
  pointer ppVar4;
  Siblings *curr_sib_01;
  Simplex_handle simplex;
  Vertex_handle tmp;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
  local_40;
  int local_34;
  
  if (curr_nbVertices <= nbVertices || star) {
    ppVar4 = (curr_sib->members_).m_flat_tree.m_data.m_seq.m_holder.m_start;
    local_40.m_ptr =
         (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
          *)ppVar4;
    while (local_40.m_ptr !=
           (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
            *)(ppVar4 + (curr_sib->members_).m_flat_tree.m_data.m_seq.m_holder.m_size)) {
      piVar1 = (vertices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar2 = (vertices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (piVar1 == piVar2) {
        if (((curr_nbVertices != nbVertices && !star) ||
            (std::
             vector<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
             ::push_back(cofaces,&local_40), star)) &&
           (curr_sib_01 = ((local_40.m_ptr)->second).children_,
           curr_sib_01->parent_ == (local_40.m_ptr)->first)) {
LAB_00136a0f:
          rec_coface(this,vertices,curr_sib_01,curr_nbVertices + 1,cofaces,star,nbVertices);
        }
      }
      else {
        iVar3 = (local_40.m_ptr)->first;
        if (iVar3 == piVar2[-1]) {
          if ((long)piVar2 - (long)piVar1 == 4 && (curr_nbVertices == nbVertices || star)) {
            std::
            vector<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
            ::push_back(cofaces,&local_40);
            if (!star) goto LAB_00136a2f;
            iVar3 = (local_40.m_ptr)->first;
          }
          curr_sib_00 = ((local_40.m_ptr)->second).children_;
          if (curr_sib_00->parent_ == iVar3) {
            piVar1 = (vertices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
            local_34 = piVar1[-1];
            (vertices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish = piVar1 + -1;
            rec_coface(this,vertices,curr_sib_00,curr_nbVertices + 1,cofaces,star,nbVertices);
            std::vector<int,_std::allocator<int>_>::push_back(vertices,&local_34);
          }
        }
        else {
          if (piVar2[-1] < iVar3) {
            return;
          }
          curr_sib_01 = ((local_40.m_ptr)->second).children_;
          if (curr_sib_01->parent_ == iVar3) goto LAB_00136a0f;
        }
      }
LAB_00136a2f:
      boost::container::
      vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
      ::operator++(&local_40);
      ppVar4 = (curr_sib->members_).m_flat_tree.m_data.m_seq.m_holder.m_start;
    }
  }
  return;
}

Assistant:

void rec_coface(std::vector<Vertex_handle> &vertices, Siblings const*curr_sib, int curr_nbVertices,
                  std::vector<Simplex_handle>& cofaces, bool star, int nbVertices) const {
    if (!(star || curr_nbVertices <= nbVertices))  // dimension of actual simplex <= nbVertices
      return;
    for (Simplex_handle simplex = curr_sib->members().begin(); simplex != curr_sib->members().end(); ++simplex) {
      if (vertices.empty()) {
        // If we reached the end of the vertices, and the simplex has more vertices than the given simplex
        // => we found a coface

        // Add a coface if we want the star or if the number of vertices of the current simplex matches with nbVertices
        bool addCoface = (star || curr_nbVertices == nbVertices);
        if (addCoface)
          cofaces.push_back(simplex);
        if ((!addCoface || star) && has_children(simplex))  // Rec call
          rec_coface(vertices, simplex->second.children(), curr_nbVertices + 1, cofaces, star, nbVertices);
      } else {
        if (simplex->first == vertices.back()) {
          // If curr_sib matches with the top vertex
          bool equalDim = (star || curr_nbVertices == nbVertices);  // dimension of actual simplex == nbVertices
          bool addCoface = vertices.size() == 1 && equalDim;
          if (addCoface)
            cofaces.push_back(simplex);
          if ((!addCoface || star) && has_children(simplex)) {
            // Rec call
            Vertex_handle tmp = vertices.back();
            vertices.pop_back();
            rec_coface(vertices, simplex->second.children(), curr_nbVertices + 1, cofaces, star, nbVertices);
            vertices.push_back(tmp);
          }
        } else if (simplex->first > vertices.back()) {
          return;
        } else {
          // (simplex->first < vertices.back()
          if (has_children(simplex))
            rec_coface(vertices, simplex->second.children(), curr_nbVertices + 1, cofaces, star, nbVertices);
        }
      }
    }
  }